

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_CopyFromUpcasted_Test::
~ExtensionSetTest_CopyFromUpcasted_Test(ExtensionSetTest_CopyFromUpcasted_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtensionSetTest, CopyFromUpcasted) {
  unittest::TestAllExtensions message1, message2;
  const Message& upcasted_message = message1;

  TestUtil::SetAllExtensions(&message1);
  message2.CopyFrom(upcasted_message);
  TestUtil::ExpectAllExtensionsSet(message2);
  // exercise copy when fields already exist
  message2.CopyFrom(upcasted_message);
  TestUtil::ExpectAllExtensionsSet(message2);
}